

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

void gen_VMLS_dp(TCGContext_conflict1 *tcg_ctx,TCGv_i64 vd,TCGv_i64 vn,TCGv_i64 vm,TCGv_ptr fpst)

{
  TCGv_i64 retval;
  TCGv_i64 tmp;
  TCGv_ptr fpst_local;
  TCGv_i64 vm_local;
  TCGv_i64 vn_local;
  TCGv_i64 vd_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  retval = tcg_temp_new_i64(tcg_ctx);
  gen_helper_vfp_muld(tcg_ctx,retval,vn,vm,fpst);
  gen_helper_vfp_negd(tcg_ctx,retval,retval);
  gen_helper_vfp_addd(tcg_ctx,vd,vd,retval,fpst);
  tcg_temp_free_i64(tcg_ctx,retval);
  return;
}

Assistant:

static void gen_VMLS_dp(TCGContext *tcg_ctx, TCGv_i64 vd, TCGv_i64 vn, TCGv_i64 vm, TCGv_ptr fpst)
{
    /*
     * VMLS: vd = vd + -(vn * vm)
     * Note that order of inputs to the add matters for NaNs.
     */
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);

    gen_helper_vfp_muld(tcg_ctx, tmp, vn, vm, fpst);
    gen_helper_vfp_negd(tcg_ctx, tmp, tmp);
    gen_helper_vfp_addd(tcg_ctx, vd, vd, tmp, fpst);
    tcg_temp_free_i64(tcg_ctx, tmp);
}